

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_settings_single_thread::session_settings_single_thread
          (session_settings_single_thread *this)

{
  ::std::
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>::
  array(&this->m_strings);
  (this->m_bools).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->m_bools).super__Base_bitset<2UL>._M_w[1] = 0;
  initialize_default_settings(this);
  return;
}

Assistant:

session_settings_single_thread::session_settings_single_thread()
	{
		initialize_default_settings(*this);
	}